

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

Gia_Man_t * Nf_ManDeriveMapping(Nf_Man_t *p)

{
  Gia_Man_t *p_00;
  int iVar1;
  int Entry;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar2;
  Nf_Mat_t *pNVar3;
  int *piVar4;
  int *piVar5;
  bool bVar6;
  Gia_Obj_t *pObj;
  int *pCut;
  int fCompl;
  int iVar;
  int Id;
  int c;
  int k;
  int i;
  Nf_Mat_t *pM;
  Vec_Int_t *vMapping;
  Nf_Man_t *p_local;
  
  if (p->pGia->vCellMapping == (Vec_Int_t *)0x0) {
    iVar1 = Gia_ManObjNum(p->pGia);
    p_01 = Vec_IntAlloc(iVar1 * 2 + (int)p->pPars->Edge + (int)p->pPars->Area * 2);
    iVar1 = Gia_ManObjNum(p->pGia);
    Vec_IntFill(p_01,iVar1 << 1,0);
    c = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->pGia->vCis);
      bVar6 = false;
      if (c < iVar1) {
        p_00 = p->pGia;
        pGVar2 = Gia_ManCi(p->pGia,c);
        fCompl = Gia_ObjId(p_00,pGVar2);
        bVar6 = fCompl != 0;
      }
      if (!bVar6) break;
      iVar1 = Nf_ObjMapRefNum(p,fCompl,1);
      if (iVar1 != 0) {
        iVar1 = Abc_Var2Lit(fCompl,1);
        Vec_IntWriteEntry(p_01,iVar1,-1);
      }
      c = c + 1;
    }
    for (c = 0; c < p->pGia->nObjs; c = c + 1) {
      pGVar2 = Gia_ManObj(p->pGia,c);
      iVar1 = Gia_ObjIsAnd(pGVar2);
      if (iVar1 != 0) {
        pGVar2 = Gia_ManObj(p->pGia,c);
        iVar1 = Gia_ObjIsBuf(pGVar2);
        if (iVar1 == 0) {
          for (iVar = 0; iVar < 2; iVar = iVar + 1) {
            iVar1 = Nf_ObjMapRefNum(p,c,iVar);
            if (iVar1 != 0) {
              pNVar3 = Nf_ObjMatchBest(p,c,iVar);
              if ((*(uint *)pNVar3 >> 0x1e & 1) == 0) {
                piVar4 = Nf_ObjCutSet(p,c);
                piVar4 = Nf_CutFromHandle(piVar4,*(uint *)pNVar3 >> 0x14 & 0x3ff);
                iVar1 = Abc_Var2Lit(c,iVar);
                Entry = Vec_IntSize(p_01);
                Vec_IntWriteEntry(p_01,iVar1,Entry);
                iVar1 = Nf_CutSize(piVar4);
                Vec_IntPush(p_01,iVar1);
                Id = 0;
                while( true ) {
                  iVar1 = Nf_CutSize(piVar4);
                  bVar6 = false;
                  if (Id < iVar1) {
                    piVar5 = Nf_CutLeaves(piVar4);
                    iVar1 = Nf_CfgVar(pNVar3->Cfg,Id);
                    pCut._4_4_ = piVar5[iVar1];
                    bVar6 = false;
                    if (pCut._4_4_ != 0) {
                      pCut._0_4_ = Nf_CfgCompl(pNVar3->Cfg,Id);
                      bVar6 = true;
                    }
                  }
                  if (!bVar6) break;
                  iVar1 = Abc_Var2Lit(pCut._4_4_,(int)pCut);
                  Vec_IntPush(p_01,iVar1);
                  Id = Id + 1;
                }
                Vec_IntPush(p_01,*(uint *)pNVar3 & 0xfffff);
              }
              else {
                iVar1 = Abc_Var2Lit(c,iVar);
                Vec_IntWriteEntry(p_01,iVar1,-1);
              }
            }
          }
        }
        else {
          iVar1 = Nf_ObjMapRefNum(p,c,1);
          if (iVar1 != 0) {
            iVar1 = Abc_Var2Lit(c,1);
            Vec_IntWriteEntry(p_01,iVar1,-1);
          }
          iVar1 = Abc_Var2Lit(c,0);
          Vec_IntWriteEntry(p_01,iVar1,-2);
        }
      }
    }
    p->pGia->vCellMapping = p_01;
    return p->pGia;
  }
  __assert_fail("p->pGia->vCellMapping == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                ,0x811,"Gia_Man_t *Nf_ManDeriveMapping(Nf_Man_t *)");
}

Assistant:

Gia_Man_t * Nf_ManDeriveMapping( Nf_Man_t * p )
{
    Vec_Int_t * vMapping;
    Nf_Mat_t * pM;
    int i, k, c, Id, iVar, fCompl, * pCut;
    assert( p->pGia->vCellMapping == NULL );
    vMapping = Vec_IntAlloc( 2*Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + (int)p->pPars->Area * 2 );
    Vec_IntFill( vMapping, 2*Gia_ManObjNum(p->pGia), 0 );
    // create CI inverters
    Gia_ManForEachCiId( p->pGia, Id, i )
    if ( Nf_ObjMapRefNum(p, Id, 1) )
        Vec_IntWriteEntry( vMapping, Abc_Var2Lit(Id, 1), -1 );
    // create internal nodes
    Gia_ManForEachAndId( p->pGia, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj(p->pGia, i);
        if ( Gia_ObjIsBuf(pObj) )
        {
            if ( Nf_ObjMapRefNum(p, i, 1) )
                Vec_IntWriteEntry( vMapping, Abc_Var2Lit(i, 1), -1 );
            Vec_IntWriteEntry( vMapping, Abc_Var2Lit(i, 0), -2 );
            continue;
        }
        for ( c = 0; c < 2; c++ )
        if ( Nf_ObjMapRefNum(p, i, c) )
        {
            pM = Nf_ObjMatchBest( p, i, c );
            // remember inverter
            if ( pM->fCompl )
            {
                Vec_IntWriteEntry( vMapping, Abc_Var2Lit(i, c), -1 );
                continue;
            }
    //        Nf_ManCutMatchPrint( p, i, c, pM );
            pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, i), pM->CutH );
            Vec_IntWriteEntry( vMapping, Abc_Var2Lit(i, c), Vec_IntSize(vMapping) );
            Vec_IntPush( vMapping, Nf_CutSize(pCut) );
            Nf_CutForEachVarCompl( pCut, pM->Cfg, iVar, fCompl, k )
                Vec_IntPush( vMapping, Abc_Var2Lit(iVar, fCompl) );
            Vec_IntPush( vMapping, pM->Gate );
        }
    }
//    assert( Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    p->pGia->vCellMapping = vMapping;
    return p->pGia;
}